

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClockingItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ClockingDirectionSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ClockingDirectionSyntax *args_1,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *args_2,Token *args_3)

{
  Token semi;
  ClockingItemSyntax *this_00;
  
  this_00 = (ClockingItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingItemSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ClockingItemSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::ClockingItemSyntax::ClockingItemSyntax(this_00,args,args_1,args_2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }